

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O3

UBool __thiscall
icu_63::DateFmtBestPatternKey::operator==(DateFmtBestPatternKey *this,CacheKeyBase *other)

{
  undefined2 uVar1;
  short sVar2;
  UBool UVar3;
  int len;
  int iVar4;
  bool bVar5;
  
  if (this != (DateFmtBestPatternKey *)other) {
    UVar3 = LocaleCacheKey<icu_63::DateFmtBestPattern>::operator==
                      (&this->super_LocaleCacheKey<icu_63::DateFmtBestPattern>,other);
    if (UVar3 == '\0') {
      bVar5 = false;
    }
    else {
      uVar1 = (undefined2)other[0xf].fCreationStatus;
      if ((uVar1 & U_ILLEGAL_ARGUMENT_ERROR) == U_ZERO_ERROR) {
        if ((short)uVar1 < 0) {
          len = *(int *)&other[0xf].fIsMaster;
        }
        else {
          len = (int)(short)uVar1 >> 5;
        }
        sVar2 = (this->fSkeleton).fUnion.fStackFields.fLengthAndFlags;
        if (sVar2 < 0) {
          iVar4 = (this->fSkeleton).fUnion.fFields.fLength;
        }
        else {
          iVar4 = (int)sVar2 >> 5;
        }
        bVar5 = false;
        if ((((int)sVar2 & 1U) == 0) && (bVar5 = false, len == iVar4)) {
          UVar3 = icu_63::UnicodeString::doEquals
                            ((UnicodeString *)(other + 0xf),&this->fSkeleton,len);
          bVar5 = UVar3 != '\0';
        }
      }
      else {
        bVar5 = (bool)(*(byte *)&(this->fSkeleton).fUnion & 1);
      }
    }
    return bVar5;
  }
  return '\x01';
}

Assistant:

virtual UBool operator==(const CacheKeyBase &other) const {
       // reflexive
       if (this == &other) { 	
           return TRUE;
       }
       if (!LocaleCacheKey<DateFmtBestPattern>::operator==(other)) {
           return FALSE;
       }
       // We know that this and other are of same class if we get this far.
       const DateFmtBestPatternKey &realOther =
               static_cast<const DateFmtBestPatternKey &>(other);
       return (realOther.fSkeleton == fSkeleton);
    }